

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.cpp
# Opt level: O2

void pzgeom::TPZWavyLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  double *pdVar1;
  int iVar2;
  TPZGeoNode *pTVar3;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this_00;
  TPZManVector<double,_3> wavedir;
  TPZManVector<double,_3> x1;
  TPZManVector<double,_3> x0;
  TPZManVector<long,_10> nodind;
  
  TPZManVector<double,_3>::TPZManVector(&x0,lowercorner);
  TPZManVector<double,_3>::TPZManVector(&x1,lowercorner);
  nodind.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&wavedir,3,(double *)&nodind);
  *x1.super_TPZVec<double>.fStore = *x0.super_TPZVec<double>.fStore + 2.0;
  wavedir.super_TPZVec<double>.fStore[1] = 1.0;
  TPZManVector<long,_10>::TPZManVector(&nodind,2);
  this = &gmesh->fNodeVec;
  iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  *nodind.super_TPZVec<long>.fStore = (long)iVar2;
  pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar2);
  TPZGeoNode::Initialize(pTVar3,&x0.super_TPZVec<double>,gmesh);
  iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  nodind.super_TPZVec<long>.fStore[1] = (long)iVar2;
  pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar2);
  TPZGeoNode::Initialize(pTVar3,&x1.super_TPZVec<double>,gmesh);
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
            (this_00,&nodind.super_TPZVec<long>,matid,gmesh);
  pdVar1 = size->fStore;
  *pdVar1 = 2.0;
  pdVar1[1] = 2.0;
  SetData(&(this_00->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).fGeo,&wavedir.super_TPZVec<double>,
          4);
  TPZManVector<long,_10>::~TPZManVector(&nodind);
  TPZManVector<double,_3>::~TPZManVector(&wavedir);
  TPZManVector<double,_3>::~TPZManVector(&x1);
  TPZManVector<double,_3>::~TPZManVector(&x0);
  return;
}

Assistant:

void TPZWavyLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> x0(lowercorner), x1(lowercorner), wavedir(3,0.);
        x1[0] = x0[0]+2.;
        wavedir[1] = 1.;
        int numwaves = 4;
        TPZManVector<int64_t> nodind(2);
        nodind[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[0]].Initialize(x0, gmesh);
        nodind[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[1]].Initialize(x1, gmesh);
        
        TPZGeoElRefPattern<TPZWavyLine> *gel = new TPZGeoElRefPattern<TPZWavyLine> (nodind,matid,gmesh);
        size[0] = 2.;
        size[1] = 2.;
        gel->Geom().SetData(wavedir, numwaves);
       
    }